

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.h
# Opt level: O0

char * FindLatestRazorAHRSSentence(char *sentencebegin,char *str)

{
  size_t sVar1;
  char *local_28;
  char *foundstr;
  char *ptr;
  char *str_local;
  char *sentencebegin_local;
  
  local_28 = (char *)0x0;
  for (foundstr = FindRazorAHRSSentence(sentencebegin,str); foundstr != (char *)0x0;
      foundstr = FindRazorAHRSSentence(sentencebegin,foundstr + sVar1)) {
    local_28 = foundstr;
    sVar1 = strlen(sentencebegin);
  }
  return local_28;
}

Assistant:

inline char* FindLatestRazorAHRSSentence(char* sentencebegin, char* str)
{
	char* ptr = NULL;
	char* foundstr = NULL;

	ptr = FindRazorAHRSSentence(sentencebegin, str);
	while (ptr) 
	{
		// Save the position of the beginning of the sentence.
		foundstr = ptr;

		// Search just after the beginning of the sentence.
		ptr = FindRazorAHRSSentence(sentencebegin, foundstr+strlen(sentencebegin));
	}

	return foundstr;
}